

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  string *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined1 *bytes_00;
  Reader *in_stack_ffffffffffffff88;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Slice::Slice(in_RDI,(char *)in_RSI);
  bytes_00 = local_28;
  (**(code **)(*(long *)in_RDI->data_ + 0x20))();
  Slice::Slice(in_RDI,in_RSI);
  Status::Corruption((Slice *)in_RSI,(Slice *)in_stack_ffffffffffffff68);
  ReportDrop(in_stack_ffffffffffffff88,(uint64_t)bytes_00,(Status *)in_RDI);
  Status::~Status((Status *)in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason, file_->GetName()));
}